

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

ON_String __thiscall ON_String::MapStringOrdinal(ON_String *this,ON_StringMapOrdinalType map_type)

{
  bool bVar1;
  int element_count;
  ON_StringMapOrdinalType in_EDX;
  undefined4 in_register_00000034;
  
  ON_String(this,(ON_String *)CONCAT44(in_register_00000034,map_type));
  bVar1 = IsNotEmpty(this);
  if (bVar1) {
    CopyArray(this);
    element_count = Length(this);
    MapStringOrdinal(in_EDX,this->m_s,element_count,this->m_s,element_count);
  }
  return (ON_String)(char *)this;
}

Assistant:

ON_String ON_String::MapStringOrdinal(
  ON_StringMapOrdinalType map_type
  ) const
{
  ON_String mapped_string(*this);
  if (mapped_string.IsNotEmpty())
  {
    mapped_string.CopyArray();
    const int length = mapped_string.Length();
    ON_String::MapStringOrdinal(map_type, mapped_string.m_s, length, mapped_string.m_s, length);
  }
  return mapped_string;
}